

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O1

Move * puppup::movegen::moveCommand
                 (Move *__return_storage_ptr__,idx step,idx cursor,string *word_s,State *state,
                 Gaddag *gaddag)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  size_type sVar4;
  ostream *poVar5;
  long lVar6;
  idx iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  long lVar16;
  bool bVar17;
  byte local_c9;
  ulong local_c8;
  long local_c0;
  byte *local_b8;
  long local_b0;
  long local_a8;
  Gaddag *local_a0;
  long local_98;
  long local_90;
  long *local_88;
  long local_80;
  idx local_78;
  Move *local_70;
  string *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  byte *local_40;
  State *local_38;
  
  lVar11 = (((gaddag->nodes_).
             super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
             ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
  sVar4 = word_s->_M_string_length;
  local_a0 = gaddag;
  if (sVar4 == 0) {
    local_c0 = 1;
    local_90 = 0;
    local_b0 = 0;
    local_c8 = 0;
    lVar6 = 0;
  }
  else {
    local_b8 = (byte *)(word_s->_M_dataplus)._M_p;
    local_40 = local_b8 + sVar4;
    local_80 = sVar4 * step;
    local_88 = (state->letter_score)._M_elems + cursor;
    local_48 = step * 8;
    local_c0 = 1;
    local_c8 = 0;
    local_b0 = 0;
    local_90 = 0;
    local_a8 = 0;
    local_78 = cursor;
    local_70 = __return_storage_ptr__;
    local_68 = word_s;
    local_38 = state;
    do {
      bVar3 = *local_b8;
      if ((byte)(bVar3 + 0x9f) < 0x1a) {
        lVar6 = *(long *)(stridx + (ulong)bVar3 * 8);
        lVar12 = lVar6;
      }
      else {
        if ((byte)(bVar3 + 0xbf) < 0x1a) {
          lVar6 = *(long *)(stridx + ((bVar3 | 0x20) << 3));
          local_c8 = local_c8 << 0x10 | cursor + 1U;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unexpected character! ",0x16);
          local_c9 = bVar3;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)&local_c9,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          lVar6 = 0x1a;
        }
        lVar12 = 0x1a;
      }
      if (lVar11 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"move command contains illegal word! ",0x24);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(local_68->_M_dataplus)._M_p,
                            local_68->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        lVar11 = -1;
      }
      else {
        lVar11 = (local_a0->nodes_).
                 super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].children._M_elems[lVar6];
      }
      if ((local_38->board)._M_elems[cursor] == 0x1b) {
        local_60 = (&board::letter_multiplier)[cursor];
        local_50 = (&scores)[lVar12];
        local_58 = (&board::word_multiplier)[cursor];
        lVar13 = -8;
        lVar14 = -2;
        bVar15 = false;
        lVar12 = 0;
        lVar6 = -1;
        do {
          lVar9 = -0x10;
          if (step < 1) {
            if (step == -0x10) {
LAB_00107d66:
              lVar9 = -1;
            }
            else if (step != -1) {
LAB_00107d6f:
              lVar9 = 0;
            }
          }
          else if (step != 1) {
            if (step != 0x10) goto LAB_00107d6f;
            goto LAB_00107d66;
          }
          uVar10 = cursor + lVar9 * lVar6;
          if ((uVar10 < 0xf1 && (uVar10 & 0x800000000000000f) != 0xf) &&
             ((&board::word_multiplier)[uVar10] != 0)) {
            lVar8 = lVar9 * lVar13;
            uVar10 = lVar9 * lVar14 + cursor;
            lVar2 = uVar10 * 8;
            lVar16 = 0;
            while (*(long *)((long)local_88 + lVar16 + lVar8 + -0x800) != 0x1b) {
              lVar12 = lVar12 + *(long *)((long)local_88 + lVar16 + lVar8);
              bVar15 = true;
              if ((0xf0 < uVar10) || ((uVar10 & 0x800000000000000f) == 0xf)) break;
              lVar1 = lVar2 + lVar16;
              lVar16 = lVar16 + lVar8;
              uVar10 = uVar10 + lVar9 * lVar6;
              bVar15 = true;
              if (*(long *)((long)&board::word_multiplier + lVar1) == 0) break;
            }
          }
          lVar13 = lVar13 + 0x10;
          lVar14 = lVar14 + 4;
          bVar17 = lVar6 < 0;
          lVar6 = lVar6 + 2;
        } while (bVar17);
        local_a8 = local_a8 + 1;
        lVar6 = local_50 * local_60;
        local_c0 = local_c0 * local_58;
        local_98 = lVar11;
        if (bVar15) {
          local_b0 = local_b0 + (lVar12 + lVar6) * local_58;
        }
      }
      else {
        lVar6 = (local_38->letter_score)._M_elems[cursor];
      }
      local_90 = local_90 + lVar6;
      cursor = cursor + step;
      local_b8 = local_b8 + 1;
      local_88 = (long *)((long)local_88 + local_48);
    } while (local_b8 != local_40);
    cursor = local_78 + local_80;
    lVar6 = 0x23;
    __return_storage_ptr__ = local_70;
    if (local_a8 < 7) {
      lVar6 = 0;
    }
  }
  if (lVar11 == -1) {
    iVar7 = -1;
  }
  else {
    iVar7 = (local_a0->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11];
  }
  __return_storage_ptr__->score = lVar6 + local_b0 + local_90 * local_c0;
  __return_storage_ptr__->word = iVar7;
  __return_storage_ptr__->cursor = cursor;
  __return_storage_ptr__->step = step;
  __return_storage_ptr__->blanks = local_c8;
  return __return_storage_ptr__;
}

Assistant:

inline Move moveCommand(idx step, idx cursor, std::string word_s,
                        const board::State& state, const trie::Gaddag& gaddag) {
    idx blanks = 0;
    idx non_multipliable_score = 0;
    idx multipliable_score = 0;
    idx word_mult = 1;
    trie::nodeid node = gaddag.get(0, trie::rev_marker);
    idx placed = 0;
    for (char c : word_s) {
        chr letter = blank;
        chr actual_letter = blank;
        if (c >= 'a' && c <= 'z') {
            actual_letter = letter = stridx[(idx)c];
        } else if (c >= 'A' && c <= 'Z') {
            letter = stridx[(idx)c + 'a' - 'A'];
            actual_letter = blank;
            blanks <<= idx(16LL);
            blanks |= cursor + 1;
        } else {
            std::cerr << "unexpected character! " << c << std::endl;
        }
        if (node != -1) {
            node = gaddag.get(node, letter);
        } else {
            std::cerr << "move command contains illegal word! " << word_s
                      << std::endl;
        }
        if (state.board[cursor] == emptiness) {
            ++placed;
            multipliable_score +=
                board::letter_multiplier[cursor] * scores[actual_letter];
            word_mult *= board::word_multiplier[cursor];

            idx orth_score = 0;
            bool works = false;
            for (idx o = -1; o <= 1; o += 2) {
                idx ostep = __impl::turn(step) * o;
                for (idx ocursor = cursor + ostep;
                     !__impl::edge(ocursor) &&
                     state.board[ocursor] != emptiness;
                     ocursor += ostep) {
                    orth_score += state.letter_score[ocursor];
                    works = true;
                }
            }

            if (works) {
                orth_score +=
                    board::letter_multiplier[cursor] * scores[actual_letter];
                non_multipliable_score +=
                    orth_score * board::word_multiplier[cursor];
            }
        } else {
            multipliable_score += state.letter_score[cursor];
        }
        cursor += step;
    }
    const idx bingo = placed >= 7 ? bingo_bonus : 0;
    const idx score =
        non_multipliable_score + word_mult * multipliable_score + bingo;
    // std::cerr << "nms: " << non_multipliable_score << std::endl;
    // std::cerr << "ms: " << multipliable_score << std::endl;
    // std::cerr << "mult: " << word_mult << std::endl;
    const idx wordid = node == -1 ? -1 : gaddag.nodeToWord(node);
    return Move{score, wordid, cursor, step, blanks};
}